

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.inl
# Opt level: O3

uint32_t __thiscall
bits::detail::
RadixSort<11U,_unsigned_long,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>::
operator()(RadixSort<11U,_unsigned_long,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>
           *this,unsigned_long *keys_in,unsigned_long *keys_temp,uint *values_in,uint *values_temp,
          uint32_t size)

{
  unsigned_long uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  uint *puVar8;
  ulong uVar9;
  uint uVar10;
  uint *puVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint *values [2];
  unsigned_long *keys [2];
  uint32_t sum [6];
  uint32_t hist [6] [2048];
  uint *local_c088 [2];
  unsigned_long *local_c078 [4];
  uint auStack_c058 [8];
  uint local_c038 [10240];
  uint auStack_2038 [2050];
  
  uVar5 = (ulong)size;
  memset(local_c038,0,0xc000);
  if (size != 0) {
    uVar9 = 0;
    do {
      uVar14 = keys_in[uVar9];
      lVar7 = 0;
      puVar8 = local_c038;
      do {
        puVar8[(uint)(uVar14 >> ((byte)lVar7 & 0x3f)) & 0x7ff] =
             puVar8[(uint)(uVar14 >> ((byte)lVar7 & 0x3f)) & 0x7ff] + 1;
        puVar8 = puVar8 + 0x800;
        lVar7 = lVar7 + 0xb;
      } while (lVar7 != 0x42);
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar5);
  }
  puVar8 = local_c038;
  lVar7 = 0;
  do {
    auStack_c058[lVar7] = *puVar8;
    *puVar8 = 0;
    lVar7 = lVar7 + 1;
    puVar8 = puVar8 + 0x800;
  } while (lVar7 != 6);
  lVar7 = 1;
  puVar8 = local_c038;
  do {
    puVar8 = puVar8 + 1;
    lVar13 = 0;
    puVar11 = puVar8;
    do {
      uVar6 = auStack_c058[lVar13];
      uVar10 = *puVar11;
      *puVar11 = uVar6;
      auStack_c058[lVar13] = uVar10 + uVar6;
      lVar13 = lVar13 + 1;
      puVar11 = puVar11 + 0x800;
    } while (lVar13 != 6);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x800);
  local_c078[0] = keys_in;
  local_c078[1] = keys_temp;
  local_c088[0] = values_in;
  local_c088[1] = values_temp;
  if (size == 0) {
    uVar5 = 0;
  }
  else {
    uVar9 = 0;
    do {
      uVar1 = keys_in[uVar9];
      uVar10 = (uint)uVar1 & 0x7ff;
      uVar6 = local_c038[uVar10];
      local_c038[uVar10] = uVar6 + 1;
      keys_temp[uVar6] = uVar1;
      values_temp[uVar6] = values_in[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  lVar7 = 1;
  local_c078[3] = keys_temp;
  local_c078[2] = keys_in;
  do {
    while (size == 0) {
      lVar7 = lVar7 + 1;
      if (lVar7 == 5) {
        return 0;
      }
    }
    uVar6 = (uint)lVar7 & 1;
    uVar9 = (ulong)(uVar6 << 3);
    uVar14 = (ulong)((uVar6 ^ 1) << 3);
    lVar13 = *(long *)((long)local_c078 + uVar9);
    lVar2 = *(long *)((long)local_c078 + uVar14);
    lVar3 = *(long *)((long)local_c088 + uVar9);
    lVar4 = *(long *)((long)local_c088 + uVar14);
    uVar9 = 0;
    do {
      uVar14 = *(ulong *)(lVar13 + uVar9 * 8);
      uVar12 = (ulong)((uint)(uVar14 >> ((char)lVar7 * '\v' & 0x3fU)) & 0x7ff);
      uVar6 = local_c038[lVar7 * 0x800 + uVar12];
      local_c038[lVar7 * 0x800 + uVar12] = uVar6 + 1;
      *(ulong *)(lVar2 + (ulong)uVar6 * 8) = uVar14;
      *(undefined4 *)(lVar4 + (ulong)uVar6 * 4) = *(undefined4 *)(lVar3 + uVar9 * 4);
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 5);
  if (size == 0) {
    return 0;
  }
  uVar9 = 0;
  do {
    uVar14 = keys_temp[uVar9];
    uVar12 = uVar14 >> 0x37;
    uVar6 = auStack_2038[uVar12];
    auStack_2038[uVar12] = uVar6 + 1;
    keys_in[uVar6] = uVar14;
    values_in[uVar6] = values_temp[uVar9];
    uVar9 = uVar9 + 1;
  } while (uVar5 != uVar9);
  return 0;
}

Assistant:

uint32_t operator()(KeyType* __restrict keys_in,
        KeyType* __restrict keys_temp, ValueType* __restrict values_in,
        ValueType* __restrict values_temp, uint32_t size) const
    {
        DecodeOp decode_op;
        EncodeOp encode_op;
        PassThrough pass_through;

        // Initialise each histogram bucket with the key value
        uint32_t hist[kHistBuckets][kHistSize] = {0};
        for (uint32_t i = 0; i < size; ++i)
        {
            const KeyType key = decode_op(keys_in[i]);
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                const uint32_t shift = bucket * kRadixBits;
                const uint32_t pos = (key >> shift) & kHistMask;
                ++hist[bucket][pos];
            }
        }

        // Update the histogram data so each entry sums the previous entries
        uint32_t sum[kHistBuckets];
        for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
        {
            sum[bucket] = hist[bucket][0];
            hist[bucket][0] = 0;
        }

        uint32_t tsum;
        for (uint32_t i = 1; i < kHistSize; ++i)
        {
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                tsum = hist[bucket][i] + sum[bucket];
                hist[bucket][i] = sum[bucket];
                sum[bucket] = tsum;
            }
        }

        // alternate input and output buffers on each radix pass
        KeyType* __restrict keys[2] = {keys_in, keys_temp};
        ValueType* __restrict values[2] = {values_in, values_temp};

        uint32_t out = 0;

        {
            // decode key on first radix pass
            const uint32_t bucket = 0;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, decode_op, pass_through);
        }

        for (uint32_t bucket = 1; bucket < kHistBuckets - 1; ++bucket)
        {
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, pass_through);
        }

        {
            // encode key on last radix pass
            const uint32_t bucket = kHistBuckets - 1;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, encode_op);
        }

        return out;
    }